

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Own<kj::WebSocket,_std::nullptr_t> __thiscall
kj::anon_unknown_36::HttpClientAdapter::WebSocketResponseImpl::acceptWebSocket
          (WebSocketResponseImpl *this,HttpHeaders *headers)

{
  size_t *psVar1;
  Header *pHVar2;
  long *plVar3;
  PromiseBase PVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  Header *pHVar8;
  int in_ECX;
  __fn *in_RDX;
  WebSocket *extraout_RDX;
  WebSocket *extraout_RDX_00;
  WebSocket *extraout_RDX_01;
  WebSocket *pWVar9;
  void *in_R8;
  long lVar10;
  Own<kj::WebSocket,_std::nullptr_t> OVar11;
  Own<kj::HttpHeaders,_std::nullptr_t> headersCopy;
  WebSocketPipe pipe;
  PromiseBase local_b8;
  undefined8 *local_b0;
  ArrayDisposer *local_a8;
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined8 uStack_98;
  _func_int **local_90;
  _func_int **local_88;
  undefined1 local_80 [40];
  RemoveConst<kj::HttpHeaders::Header> *local_58;
  Header *local_50;
  
  HttpHeaders::clone((HttpHeaders *)local_80,in_RDX,in_RDX,in_ECX,in_R8);
  heap<kj::HttpHeaders>((kj *)&local_b0,(HttpHeaders *)local_80);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_80);
  newWebSocketPipe();
  psVar1 = &(headers->indexedHeaders).size_;
  *(int *)psVar1 = (int)*psVar1 + 1;
  local_80._0_8_ = &headers->indexedHeaders;
  local_80._8_8_ = headers;
  Promise<void>::
  attach<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,decltype(nullptr)>>
            ((Promise<void> *)&local_b8,
             (Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
              *)&(headers->unindexedHeaders).builder.pos);
  pHVar8 = (Header *)operator_new(0x30);
  uVar7 = local_80._8_8_;
  PVar4.node.ptr = local_b8.node.ptr;
  uVar5 = (undefined4)uStack_98;
  uVar6 = uStack_98._4_4_;
  uStack_98 = 0;
  local_b8.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
  (pHVar8->name).content.ptr = (char *)&PTR_send_00641758;
  *(undefined4 *)&(pHVar8->name).content.size_ = local_a0;
  *(undefined4 *)((long)&(pHVar8->name).content.size_ + 4) = uStack_9c;
  *(undefined4 *)&(pHVar8->value).content.ptr = uVar5;
  *(undefined4 *)((long)&(pHVar8->value).content.ptr + 4) = uVar6;
  *(undefined1 *)&(pHVar8->value).content.size_ = 1;
  pHVar8[1].name.content.ptr = (char *)PVar4.node.ptr;
  *(undefined2 *)&pHVar8[1].name.content.size_ = 0;
  if ((HttpHeaders *)local_80._8_8_ != (HttpHeaders *)0x0) {
    local_80._8_8_ = (StringPtr *)0x0;
    (*(code *)(((((Vector<kj::StringPtr> *)local_80._0_8_)->builder).ptr)->content).ptr)
              (local_80._0_8_,
               (long)(HttpHeaderTable **)uVar7 +
               (long)(*(HttpHeaderTable **)uVar7)[-1].idsByName.ptr);
  }
  pHVar2 = (headers->unindexedHeaders).builder.ptr;
  local_80._0_4_ = 0x65;
  local_80._8_8_ = "Switching Protocols";
  local_80._16_8_ = 0x14;
  local_80._24_8_ = local_a8;
  local_58 = (RemoveConst<kj::HttpHeaders::Header> *)operator_new(0x28);
  (local_58->name).content.ptr = (char *)&PTR___cxa_pure_virtual_006299b8;
  (local_58->name).content.size_ = (size_t)local_b0;
  (local_58->value).content.ptr = (char *)local_a8;
  local_a8 = (ArrayDisposer *)0x0;
  (local_58->value).content.size_ =
       (size_t)&kj::_::
                HeapDisposer<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket>::
                instance;
  local_58[1].name.content.ptr = (char *)pHVar8;
  (local_58->name).content.ptr = (char *)&PTR_disposeImpl_00644398;
  local_80._32_4_ = 2;
  local_50 = pHVar8;
  (**(code **)((pHVar2->name).content.ptr + 0x10))(pHVar2,local_80);
  OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>::
  destroy((OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>
           *)(local_80 + 0x20));
  (this->super_Response)._vptr_Response = local_90;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = local_88;
  local_88 = (_func_int **)0x0;
  lVar10 = 0x10;
  pWVar9 = extraout_RDX;
  do {
    plVar3 = *(long **)((long)&uStack_98 + lVar10);
    if (plVar3 != (long *)0x0) {
      *(undefined8 *)((long)&uStack_98 + lVar10) = 0;
      (**(code **)**(undefined8 **)((long)&local_a0 + lVar10))
                (*(undefined8 **)((long)&local_a0 + lVar10),
                 (long)plVar3 + *(long *)(*plVar3 + -0x10));
      pWVar9 = extraout_RDX_00;
    }
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != -0x10);
  if (local_a8 != (ArrayDisposer *)0x0) {
    local_a8 = (ArrayDisposer *)0x0;
    (**(code **)*local_b0)();
    pWVar9 = extraout_RDX_01;
  }
  OVar11.ptr = pWVar9;
  OVar11.disposer = (Disposer *)this;
  return OVar11;
}

Assistant:

kj::Own<WebSocket> acceptWebSocket(const HttpHeaders& headers) override {
      // The caller of HttpClient is allowed to assume that the headers remain valid until the body
      // stream is dropped, but the HttpService implementation is allowed to send headers that are
      // only valid until acceptWebSocket() returns, so we have to copy.
      auto headersCopy = kj::heap(headers.clone());

      auto pipe = newWebSocketPipe();

      // Wrap the client-side WebSocket in a wrapper that delays clean close of the WebSocket until
      // the service's request promise has finished.
      kj::Own<WebSocket> wrapper =
          kj::heap<DelayedCloseWebSocket>(kj::mv(pipe.ends[0]), task.attach(kj::addRef(*this)));
      fulfiller->fulfill({
        101, "Switching Protocols", headersCopy.get(),
        wrapper.attach(kj::mv(headersCopy))
      });
      return kj::mv(pipe.ends[1]);
    }